

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::_storeflagruns(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  stream *psVar5;
  _flagrun *p_Var6;
  int local_14;
  int i;
  stream *f;
  
  if (serverflagruns != 0) {
    pcVar4 = path("./config/flagruns.cfg",true);
    psVar5 = openutf8file(pcVar4,"w",(stream *)0x0);
    if (psVar5 != (stream *)0x0) {
      (*psVar5->_vptr_stream[0x10])
                (psVar5,"//Automatically generated by QServ at exit: lists best flagruns\n\n");
      for (local_14 = 0;
          iVar3 = vector<server::_flagrun>::length((vector<server::_flagrun> *)_flagruns),
          local_14 < iVar3; local_14 = local_14 + 1) {
        p_Var6 = vector<server::_flagrun>::operator[]
                           ((vector<server::_flagrun> *)_flagruns,local_14);
        uVar1 = p_Var6->gamemode;
        p_Var6 = vector<server::_flagrun>::operator[]
                           ((vector<server::_flagrun> *)_flagruns,local_14);
        pcVar4 = p_Var6->map;
        p_Var6 = vector<server::_flagrun>::operator[]
                           ((vector<server::_flagrun> *)_flagruns,local_14);
        uVar2 = p_Var6->timeused;
        p_Var6 = vector<server::_flagrun>::operator[]
                           ((vector<server::_flagrun> *)_flagruns,local_14);
        (*psVar5->_vptr_stream[0x10])
                  (psVar5,"flagrun %i \"%s\" %i \"%s\"\n",(ulong)uVar1,pcVar4,(ulong)uVar2,
                   p_Var6->name);
      }
      if (psVar5 != (stream *)0x0) {
        (*psVar5->_vptr_stream[1])();
      }
    }
  }
  return;
}

Assistant:

void _storeflagruns()
    {
        if(serverflagruns)
        {
            stream *f = openutf8file(path("./config/flagruns.cfg", true), "w");
            if(f)
            {
                f->printf("//Automatically generated by QServ at exit: lists best flagruns\n\n");
                loopv(_flagruns)
                f->printf("flagrun %i \"%s\" %i \"%s\"\n", _flagruns[i].gamemode, _flagruns[i].map, _flagruns[i].timeused, _flagruns[i].name);
                delete f;
            }
        }
    }